

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O3

uint8 * __thiscall
sentencepiece::ModelProto::_InternalSerialize
          (ModelProto *this,uint8 *target,EpsCopyOutputStream *stream)

{
  TrainerSpec *this_00;
  NormalizerSpec *pNVar1;
  SelfTestData *this_01;
  void *pvVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  Type *this_02;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  int index;
  size_t __n;
  uint8 *puVar9;
  uint8 *puVar10;
  
  iVar8 = (this->pieces_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar8 != 0) {
    index = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_02 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<sentencepiece::ModelProto_SentencePiece>::TypeHandler>
                          (&(this->pieces_).super_RepeatedPtrFieldBase,index);
      *target = '\n';
      uVar7 = (this_02->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar7 < 0x80) {
        target[1] = (byte)uVar7;
        puVar9 = target + 2;
      }
      else {
        target[1] = (byte)uVar7 | 0x80;
        if (uVar7 < 0x4000) {
          target[2] = (uint8)(uVar7 >> 7);
          puVar9 = target + 3;
        }
        else {
          puVar9 = target + 3;
          uVar7 = uVar7 >> 7;
          do {
            puVar10 = puVar9;
            puVar10[-1] = (byte)uVar7 | 0x80;
            uVar5 = uVar7 >> 7;
            puVar9 = puVar10 + 1;
            bVar3 = 0x3fff < uVar7;
            uVar7 = uVar5;
          } while (bVar3);
          *puVar10 = (uint8)uVar5;
        }
      }
      target = ModelProto_SentencePiece::_InternalSerialize(this_02,puVar9,stream);
      index = index + 1;
    } while (index != iVar8);
  }
  uVar7 = (this->_has_bits_).has_bits_[0];
  if ((uVar7 & 1) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_00 = this->trainer_spec_;
    *target = '\x12';
    uVar5 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    if (uVar5 < 0x80) {
      target[1] = (byte)uVar5;
      puVar9 = target + 2;
    }
    else {
      target[1] = (byte)uVar5 | 0x80;
      if (uVar5 < 0x4000) {
        target[2] = (uint8)(uVar5 >> 7);
        puVar9 = target + 3;
      }
      else {
        puVar9 = target + 3;
        uVar5 = uVar5 >> 7;
        do {
          puVar10 = puVar9;
          puVar10[-1] = (byte)uVar5 | 0x80;
          uVar4 = uVar5 >> 7;
          puVar9 = puVar10 + 1;
          bVar3 = 0x3fff < uVar5;
          uVar5 = uVar4;
        } while (bVar3);
        *puVar10 = (uint8)uVar4;
      }
    }
    target = TrainerSpec::_InternalSerialize(this_00,puVar9,stream);
  }
  if ((uVar7 & 2) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    pNVar1 = this->normalizer_spec_;
    *target = '\x1a';
    uVar5 = (pNVar1->_cached_size_).size_.super___atomic_base<int>._M_i;
    if (uVar5 < 0x80) {
      target[1] = (byte)uVar5;
      puVar9 = target + 2;
    }
    else {
      target[1] = (byte)uVar5 | 0x80;
      if (uVar5 < 0x4000) {
        target[2] = (uint8)(uVar5 >> 7);
        puVar9 = target + 3;
      }
      else {
        puVar9 = target + 3;
        uVar5 = uVar5 >> 7;
        do {
          puVar10 = puVar9;
          puVar10[-1] = (byte)uVar5 | 0x80;
          uVar4 = uVar5 >> 7;
          puVar9 = puVar10 + 1;
          bVar3 = 0x3fff < uVar5;
          uVar5 = uVar4;
        } while (bVar3);
        *puVar10 = (uint8)uVar4;
      }
    }
    target = NormalizerSpec::_InternalSerialize(pNVar1,puVar9,stream);
  }
  if ((uVar7 & 4) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_01 = this->self_test_data_;
    *target = '\"';
    uVar5 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
    if (uVar5 < 0x80) {
      target[1] = (byte)uVar5;
      puVar9 = target + 2;
    }
    else {
      target[1] = (byte)uVar5 | 0x80;
      if (uVar5 < 0x4000) {
        target[2] = (uint8)(uVar5 >> 7);
        puVar9 = target + 3;
      }
      else {
        puVar9 = target + 3;
        uVar5 = uVar5 >> 7;
        do {
          puVar10 = puVar9;
          puVar10[-1] = (byte)uVar5 | 0x80;
          uVar4 = uVar5 >> 7;
          puVar9 = puVar10 + 1;
          bVar3 = 0x3fff < uVar5;
          uVar5 = uVar4;
        } while (bVar3);
        *puVar10 = (uint8)uVar4;
      }
    }
    target = SelfTestData::_InternalSerialize(this_01,puVar9,stream);
  }
  if ((uVar7 & 8) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    pNVar1 = this->denormalizer_spec_;
    *target = '*';
    uVar7 = (pNVar1->_cached_size_).size_.super___atomic_base<int>._M_i;
    if (uVar7 < 0x80) {
      target[1] = (byte)uVar7;
      puVar9 = target + 2;
    }
    else {
      target[1] = (byte)uVar7 | 0x80;
      if (uVar7 < 0x4000) {
        target[2] = (uint8)(uVar7 >> 7);
        puVar9 = target + 3;
      }
      else {
        puVar9 = target + 3;
        uVar7 = uVar7 >> 7;
        do {
          puVar10 = puVar9;
          puVar10[-1] = (byte)uVar7 | 0x80;
          uVar5 = uVar7 >> 7;
          puVar9 = puVar10 + 1;
          bVar3 = 0x3fff < uVar7;
          uVar7 = uVar5;
        } while (bVar3);
        *puVar10 = (uint8)uVar5;
      }
    }
    target = NormalizerSpec::_InternalSerialize(pNVar1,puVar9,stream);
  }
  puVar9 = google::protobuf::internal::ExtensionSet::_InternalSerialize
                     (&this->_extensions_,200,0x20000000,target,stream);
  pvVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    uVar6 = (ulong)pvVar2 & 0xfffffffffffffffe;
    pvVar2 = *(void **)(uVar6 + 8);
    iVar8 = (int)*(undefined8 *)(uVar6 + 0x10);
    __n = (size_t)iVar8;
    if ((long)stream->end_ - (long)puVar9 < (long)__n) {
      puVar9 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,pvVar2,iVar8,puVar9);
      return puVar9;
    }
    memcpy(puVar9,pvVar2,__n);
    puVar9 = puVar9 + __n;
  }
  return puVar9;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* ModelProto::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:sentencepiece.ModelProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .sentencepiece.ModelProto.SentencePiece pieces = 1;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_pieces_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(1, this->_internal_pieces(i), target, stream);
  }

  cached_has_bits = _has_bits_[0];
  // optional .sentencepiece.TrainerSpec trainer_spec = 2;
  if (cached_has_bits & 0x00000001u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        2, _Internal::trainer_spec(this), target, stream);
  }

  // optional .sentencepiece.NormalizerSpec normalizer_spec = 3;
  if (cached_has_bits & 0x00000002u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        3, _Internal::normalizer_spec(this), target, stream);
  }

  // optional .sentencepiece.SelfTestData self_test_data = 4;
  if (cached_has_bits & 0x00000004u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        4, _Internal::self_test_data(this), target, stream);
  }

  // optional .sentencepiece.NormalizerSpec denormalizer_spec = 5;
  if (cached_has_bits & 0x00000008u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        5, _Internal::denormalizer_spec(this), target, stream);
  }

  // Extension range [200, 536870912)
  target = _extensions_._InternalSerialize(
      200, 536870912, target, stream);

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:sentencepiece.ModelProto)
  return target;
}